

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_photogrammetry.cpp
# Opt level: O2

bool __thiscall
ON_AerialPhotoCameraPosition::SetOrientationRotation
          (ON_AerialPhotoCameraPosition *this,ON_Xform camera_rotation)

{
  double dVar1;
  long lVar2;
  double *pdVar3;
  ON_Xform *pOVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double local_b8;
  double local_a8;
  double local_98;
  ON_3dVector Z;
  ON_3dVector X;
  ON_3dVector Y;
  ON_3dVector local_38;
  
  pdVar3 = (double *)&camera_rotation;
  pOVar4 = &this->m_orientation_rotation;
  for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
    pOVar4->m_xform[0][0] = *pdVar3;
    pdVar3 = pdVar3 + 1;
    pOVar4 = (ON_Xform *)(pOVar4->m_xform[0] + 1);
  }
  ON_3dVector::ON_3dVector
            (&X,camera_rotation.m_xform[0][0],camera_rotation.m_xform[1][0],
             camera_rotation.m_xform[2][0]);
  ON_3dVector::ON_3dVector
            (&Y,camera_rotation.m_xform[0][1],camera_rotation.m_xform[1][1],
             camera_rotation.m_xform[2][1]);
  ON_3dVector::ON_3dVector
            (&Z,camera_rotation.m_xform[0][2],camera_rotation.m_xform[1][2],
             camera_rotation.m_xform[2][2]);
  (this->m_orientation_right).z = X.z;
  (this->m_orientation_right).x = X.x;
  (this->m_orientation_right).y = X.y;
  (this->m_orientation_up).x = Y.x;
  (this->m_orientation_up).y = Y.y;
  (this->m_orientation_up).z = Y.z;
  ON_3dVector::operator-(&local_38,&Z);
  (this->m_orientation_direction).z = local_38.z;
  (this->m_orientation_direction).x = local_38.x;
  (this->m_orientation_direction).y = local_38.y;
  dVar1 = 1.0 - Z.x * Z.x;
  local_98 = 0.0;
  if (0.0 < dVar1) {
    if (dVar1 < 0.0) {
      local_98 = sqrt(dVar1);
    }
    else {
      local_98 = SQRT(dVar1);
    }
  }
  if ((ABS(local_98) <= 2.220446049250313e-16) || (0.9999999999999998 <= ABS(Z.x))) {
    local_98 = 0.0;
    Z.x = *(double *)(&DAT_006924c0 + (ulong)(Z.x < 0.0) * 8);
LAB_00575f5a:
    local_a8 = (double)(-(ulong)(-X.z == Y.y) & (ulong)Y.y |
                       ~-(ulong)(-X.z == Y.y) & (ulong)((Y.y - X.z) * 0.5));
    auVar7 = ZEXT816(0x3ff0000000000000);
    local_b8 = Z.x;
  }
  else {
    if ((ABS(Z.x) <= 2.220446049250313e-16) || (0.9999999999999998 <= ABS(local_98))) {
      Z.x = 0.0;
      if (local_98 < 0.0) {
        local_98 = -1.0;
        goto LAB_00575f5a;
      }
      local_98 = 1.0;
    }
    else if (local_98 <= 0.0) goto LAB_00575f5a;
    auVar6._8_8_ = -Z.y;
    auVar6._0_8_ = Z.z;
    auVar7._8_4_ = SUB84(local_98,0);
    auVar7._0_8_ = local_98;
    auVar7._12_4_ = (int)((ulong)local_98 >> 0x20);
    auVar7 = divpd(auVar6,auVar7);
    local_a8 = X.x / local_98;
    local_b8 = Z.x;
  }
  dVar1 = atan2(auVar7._8_8_,auVar7._0_8_);
  (this->m_orientation_angles_radians).x = dVar1;
  dVar1 = atan2(local_b8,local_98);
  (this->m_orientation_angles_radians).y = dVar1;
  dVar1 = atan2(local_b8,local_a8);
  (this->m_orientation_angles_radians).z = dVar1;
  auVar5._0_8_ = (this->m_orientation_angles_radians).x * 180.0;
  auVar5._8_8_ = (this->m_orientation_angles_radians).y * 180.0;
  auVar7 = divpd(auVar5,_DAT_006a1ce0);
  (this->m_orientation_angles_degrees).x = (double)auVar7._0_8_;
  (this->m_orientation_angles_degrees).y = (double)auVar7._8_8_;
  (this->m_orientation_angles_degrees).z = (dVar1 * 180.0) / 3.141592653589793;
  this->m_status = this->m_status | 2;
  return true;
}

Assistant:

bool ON_AerialPhotoCameraPosition::SetOrientationRotation(
    ON_Xform camera_rotation
    )
{
  m_orientation_rotation = camera_rotation;

  const ON_3dVector X(camera_rotation.m_xform[0][0],camera_rotation.m_xform[1][0],camera_rotation.m_xform[2][0]);
  const ON_3dVector Y(camera_rotation.m_xform[0][1],camera_rotation.m_xform[1][1],camera_rotation.m_xform[2][1]);
  const ON_3dVector Z(camera_rotation.m_xform[0][2],camera_rotation.m_xform[1][2],camera_rotation.m_xform[2][2]);

  m_orientation_right = X;
  m_orientation_up = Y;
  m_orientation_direction = -Z;

  double s1, c1, s2, c2, s3, c3;

  s2 = Z.x;
  double a = 1.0 - s2*s2;
  c2 = (a > 0.0) ? sqrt(a) : 0.0;
  if ( fabs(c2) <= ON_EPSILON || fabs(s2) >= 1.0-ON_EPSILON )
  {
    s2 = (s2 < 0.0) ? -1.0 : 1.0;
    c2 = 0.0;
  }
  else if ( fabs(s2) <= ON_EPSILON || fabs(c2) >= 1.0-ON_EPSILON )
  {
    c2 = (c2 < 0.0) ? -1.0 : 1.0;
    s2 = 0.0;
  }

  if ( c2 > 0.0 )
  {
    s1 = -Z.y/c2;
    c1 =  Z.z/c2;
    s3 = -Y.x/c2;
    c3 =  X.x/c2;
  }
  else
  {
    s1 = 0.0;
    c1 = 1.0;
    s3 = ( X.y ==  Y.z ) ? X.y : 0.5*(X.y + Y.z);
    c3 = ( Y.y == -X.z ) ? Y.y : 0.5*(Y.y - X.z);
  }

  m_orientation_angles_radians.x = atan2(s1,c1);
  m_orientation_angles_radians.y = atan2(s2,c2);
  m_orientation_angles_radians.z = atan2(s2,c3);

  m_orientation_angles_degrees.x = m_orientation_angles_radians.x*180.0/ON_PI;
  m_orientation_angles_degrees.y = m_orientation_angles_radians.y*180.0/ON_PI;
  m_orientation_angles_degrees.z = m_orientation_angles_radians.z*180.0/ON_PI;

  m_status |= 2;

  return true;
}